

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  bool bVar2;
  
  pMVar1 = this->head_;
  bVar2 = pMVar1 == (MemoryAccountantAllocationNode *)0x0;
  if (this->useCacheSizes_ == false) {
    if (pMVar1 != (MemoryAccountantAllocationNode *)0x0) {
      do {
        if (pMVar1->size_ == size) goto joined_r0x001355bd;
        pMVar1 = pMVar1->next_;
        bVar2 = pMVar1 == (MemoryAccountantAllocationNode *)0x0;
      } while (!bVar2);
    }
  }
  else if (pMVar1 != (MemoryAccountantAllocationNode *)0x0) {
    do {
      if (pMVar1->size_ < size) {
        if (pMVar1->next_ == (MemoryAccountantAllocationNode *)0x0) {
joined_r0x001355bd:
          if (bVar2) {
            return (MemoryAccountantAllocationNode *)0x0;
          }
          return pMVar1;
        }
        if (size <= pMVar1->size_) goto LAB_00135586;
      }
      else {
LAB_00135586:
        if (size <= pMVar1->next_->size_ - 1) goto joined_r0x001355bd;
      }
      pMVar1 = pMVar1->next_;
      bVar2 = pMVar1 == (MemoryAccountantAllocationNode *)0x0;
    } while (!bVar2);
  }
  return (MemoryAccountantAllocationNode *)0x0;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findNodeOfSize(size_t size) const
{
    if (useCacheSizes_) {
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
            if (size > node->size_ && node->next_ == NULLPTR)
                return node;
            else if (size <= node->size_ && !(node->next_->size_ != 0 && node->next_->size_ <= size))
                return node;
        }
    }
    else
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
            if (node->size_ == size)
                return node;
    return NULLPTR;
}